

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O0

bool __thiscall QSqlQuery::seek(QSqlQuery *this,int index,bool relative)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  byte in_DL;
  int in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  int actualIdx;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff9c;
  int local_54;
  bool local_39;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isSelect((QSqlQuery *)0x139516);
  if ((bVar2) && (bVar2 = isActive((QSqlQuery *)0x139526), bVar2)) {
    if ((in_DL & 1) == 0) {
      local_54 = in_ESI;
      if (in_ESI < 0) {
        plVar1 = *(long **)(*(long *)&in_RDI->context + 8);
        (**(code **)(*plVar1 + 0x18))(plVar1,0xffffffff);
        local_39 = false;
        goto LAB_00139800;
      }
    }
    else {
      in_stack_ffffffffffffff9c = at((QSqlQuery *)0x139582);
      if (in_stack_ffffffffffffff9c == -2) {
        if (-1 < in_ESI) {
          local_39 = false;
          goto LAB_00139800;
        }
        (**(code **)(**(long **)(*(long *)&in_RDI->context + 8) + 0xa8))();
        iVar4 = at((QSqlQuery *)0x1395e3);
        local_54 = iVar4 + in_ESI + 1;
      }
      else if (in_stack_ffffffffffffff9c == -1) {
        if (in_ESI < 1) {
          local_39 = false;
          goto LAB_00139800;
        }
        local_54 = in_ESI + -1;
      }
      else {
        iVar4 = at((QSqlQuery *)0x139606);
        if (iVar4 + in_ESI < 0) {
          plVar1 = *(long **)(*(long *)&in_RDI->context + 8);
          (**(code **)(*plVar1 + 0x18))(plVar1,0xffffffff);
          local_39 = false;
          goto LAB_00139800;
        }
        local_54 = at((QSqlQuery *)0x13963a);
        local_54 = local_54 + in_ESI;
      }
    }
    bVar2 = isForwardOnly((QSqlQuery *)0x13964e);
    if ((bVar2) && (iVar4 = local_54, iVar3 = at((QSqlQuery *)0x139669), iVar4 < iVar3)) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      lcSqlQuery();
      anon_unknown.dwarf_cb9f0::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (QLoggingCategory *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
        anon_unknown.dwarf_cb9f0::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1396b7);
        QMessageLogger::QMessageLogger
                  (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff9c,iVar4),
                   in_stack_ffffffffffffff94,
                   (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                   (char *)0x1396cd);
        QMessageLogger::warning
                  (local_38,"QSqlQuery::seek: cannot seek backwards in a forward only query");
        local_10 = local_10 & 0xffffffffffffff00;
      }
      local_39 = false;
    }
    else {
      iVar4 = local_54;
      iVar3 = at((QSqlQuery *)0x139703);
      if ((iVar4 == iVar3 + 1) && (iVar4 = at((QSqlQuery *)0x13971a), iVar4 != -1)) {
        uVar5 = (**(code **)(**(long **)(*(long *)&in_RDI->context + 8) + 0x90))();
        if ((uVar5 & 1) == 0) {
          plVar1 = *(long **)(*(long *)&in_RDI->context + 8);
          (**(code **)(*plVar1 + 0x18))(plVar1,0xfffffffe);
          local_39 = false;
        }
        else {
          local_39 = true;
        }
      }
      else {
        iVar4 = local_54;
        iVar3 = at((QSqlQuery *)0x139775);
        if (iVar4 == iVar3 + -1) {
          uVar5 = (**(code **)(**(long **)(*(long *)&in_RDI->context + 8) + 0x98))();
          if ((uVar5 & 1) == 0) {
            plVar1 = *(long **)(*(long *)&in_RDI->context + 8);
            (**(code **)(*plVar1 + 0x18))(plVar1,0xffffffff);
            local_39 = false;
          }
          else {
            local_39 = true;
          }
        }
        else {
          plVar1 = *(long **)(*(long *)&in_RDI->context + 8);
          uVar5 = (**(code **)(*plVar1 + 0x88))(plVar1,local_54);
          if ((uVar5 & 1) == 0) {
            plVar1 = *(long **)(*(long *)&in_RDI->context + 8);
            (**(code **)(*plVar1 + 0x18))(plVar1,0xfffffffe);
            local_39 = false;
          }
          else {
            local_39 = true;
          }
        }
      }
    }
  }
  else {
    local_39 = false;
  }
LAB_00139800:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool QSqlQuery::seek(int index, bool relative)
{
    if (!isSelect() || !isActive())
        return false;
    int actualIdx;
    if (!relative) { // arbitrary seek
        if (index < 0) {
            d->sqlResult->setAt(QSql::BeforeFirstRow);
            return false;
        }
        actualIdx = index;
    } else {
        switch (at()) { // relative seek
        case QSql::BeforeFirstRow:
            if (index > 0)
                actualIdx = index - 1;
            else {
                return false;
            }
            break;
        case QSql::AfterLastRow:
            if (index < 0) {
                d->sqlResult->fetchLast();
                actualIdx = at() + index + 1;
            } else {
                return false;
            }
            break;
        default:
            if ((at() + index) < 0) {
                d->sqlResult->setAt(QSql::BeforeFirstRow);
                return false;
            }
            actualIdx = at() + index;
            break;
        }
    }
    // let drivers optimize
    if (isForwardOnly() && actualIdx < at()) {
        qCWarning(lcSqlQuery, "QSqlQuery::seek: cannot seek backwards in a forward only query");
        return false;
    }
    if (actualIdx == (at() + 1) && at() != QSql::BeforeFirstRow) {
        if (!d->sqlResult->fetchNext()) {
            d->sqlResult->setAt(QSql::AfterLastRow);
            return false;
        }
        return true;
    }
    if (actualIdx == (at() - 1)) {
        if (!d->sqlResult->fetchPrevious()) {
            d->sqlResult->setAt(QSql::BeforeFirstRow);
            return false;
        }
        return true;
    }
    if (!d->sqlResult->fetch(actualIdx)) {
        d->sqlResult->setAt(QSql::AfterLastRow);
        return false;
    }
    return true;
}